

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::Union(ON_BoundingBox *this,ON_BoundingBox *a)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  ON_BoundingBox *a_local;
  ON_BoundingBox *this_local;
  
  bVar3 = IsValid(this);
  if (bVar3) {
    bVar3 = IsValid(a);
    if (bVar3) {
      if ((a->m_min).x < (this->m_min).x) {
        (this->m_min).x = (a->m_min).x;
      }
      if ((a->m_min).y < (this->m_min).y) {
        (this->m_min).y = (a->m_min).y;
      }
      if ((a->m_min).z < (this->m_min).z) {
        (this->m_min).z = (a->m_min).z;
      }
      dVar2 = (a->m_max).x;
      if ((this->m_max).x <= dVar2 && dVar2 != (this->m_max).x) {
        (this->m_max).x = (a->m_max).x;
      }
      dVar2 = (a->m_max).y;
      pdVar1 = &(this->m_max).y;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (this->m_max).y = (a->m_max).y;
      }
      dVar2 = (a->m_max).z;
      pdVar1 = &(this->m_max).z;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (this->m_max).z = (a->m_max).z;
      }
    }
  }
  else {
    bVar3 = IsValid(a);
    if (bVar3) {
      memcpy(this,a,0x30);
    }
    else {
      Destroy(this);
    }
  }
  bVar3 = IsValid(this);
  return bVar3;
}

Assistant:

bool ON_BoundingBox::Union(
          const ON_BoundingBox& a
          )
{
  if ( IsValid() ) {
    if ( a.IsValid() ) {
      if ( a.m_min.x < m_min.x )
        m_min.x = a.m_min.x;
      if ( a.m_min.y < m_min.y )
        m_min.y = a.m_min.y;
      if ( a.m_min.z < m_min.z )
        m_min.z = a.m_min.z;
      if ( a.m_max.x > m_max.x )
        m_max.x = a.m_max.x;
      if ( a.m_max.y > m_max.y )
        m_max.y = a.m_max.y;
      if ( a.m_max.z > m_max.z )
        m_max.z = a.m_max.z;
    }
  }
  else if ( a.IsValid() ) {
    *this = a;
  }
  else {
    Destroy();
  }
  return IsValid();
}